

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  short *psVar1;
  mbedtls_mpi *pmVar2;
  mbedtls_mpi *pmVar3;
  int iVar4;
  undefined1 local_c0 [8];
  mbedtls_mpi G;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi U1;
  mbedtls_mpi U2;
  mbedtls_mpi TV;
  mbedtls_mpi V1;
  mbedtls_mpi V2;
  mbedtls_mpi TU;
  
  iVar4 = mbedtls_mpi_cmp_int(N,1);
  if (iVar4 < 1) {
    return -4;
  }
  G.p._0_4_ = 1;
  TB.s = 0;
  TB.n = 0;
  TB._12_4_ = 0;
  V2.s = 0;
  V2.n = 0;
  V2._12_4_ = 0;
  TA.s = 0;
  TA.n = 0;
  TA._12_4_ = 0;
  U1.s = 0;
  U1.n = 0;
  U1._12_4_ = 0;
  local_c0 = (undefined1  [8])0x0;
  G.s = 0;
  G.n = 0;
  G._12_4_ = 0;
  U2.s = 0;
  U2.n = 0;
  U2._12_4_ = 0;
  TV.s = 0;
  TV.n = 0;
  TV._12_4_ = 0;
  V1.s = 0;
  V1.n = 0;
  V1._12_4_ = 0;
  TB.p._0_4_ = G.p._0_4_;
  TA.p._0_4_ = G.p._0_4_;
  U1.p._0_4_ = G.p._0_4_;
  U2.p._0_4_ = G.p._0_4_;
  TV.p._0_4_ = G.p._0_4_;
  V1.p._0_4_ = G.p._0_4_;
  V2.p._0_4_ = G.p._0_4_;
  iVar4 = mbedtls_mpi_gcd((mbedtls_mpi *)local_c0,A,N);
  if (iVar4 == 0) {
    iVar4 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_c0,1);
    if (iVar4 == 0) {
      iVar4 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&TB.s,A,N);
      if (((((iVar4 == 0) &&
            (iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&TB.s), iVar4 == 0)) &&
           (iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&G.s,N), iVar4 == 0)) &&
          ((iVar4 = mbedtls_mpi_copy((mbedtls_mpi *)&U2.s,N), iVar4 == 0 &&
           (iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&TA.s,1), iVar4 == 0)))) &&
         ((iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&U1.s,0), iVar4 == 0 &&
          ((iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&TV.s,0), iVar4 == 0 &&
           (iVar4 = mbedtls_mpi_lset((mbedtls_mpi *)&V1.s,1), iVar4 == 0)))))) {
        psVar1 = &TV.s;
        do {
          while ((*(byte *)V2._8_8_ & 1) == 0) {
            mbedtls_mpi_shift_r((mbedtls_mpi *)&V2.s,1);
            if ((((*(byte *)TA._8_8_ & 1) != 0) || ((*(byte *)U1._8_8_ & 1) != 0)) &&
               ((iVar4 = mbedtls_mpi_add_mpi((mbedtls_mpi *)&TA.s,(mbedtls_mpi *)&TA.s,
                                             (mbedtls_mpi *)&G.s), iVar4 != 0 ||
                (iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U1.s,(mbedtls_mpi *)&U1.s,
                                             (mbedtls_mpi *)&TB.s), iVar4 != 0))))
            goto LAB_0019adc9;
            mbedtls_mpi_shift_r((mbedtls_mpi *)&TA.s,1);
            mbedtls_mpi_shift_r((mbedtls_mpi *)&U1.s,1);
          }
          while ((*(byte *)U2._8_8_ & 1) == 0) {
            mbedtls_mpi_shift_r((mbedtls_mpi *)&U2.s,1);
            if ((((*(byte *)TV._8_8_ & 1) != 0) || ((*(byte *)V1._8_8_ & 1) != 0)) &&
               ((iVar4 = mbedtls_mpi_add_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,
                                             (mbedtls_mpi *)&G.s), iVar4 != 0 ||
                (iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&V1.s,(mbedtls_mpi *)&V1.s,
                                             (mbedtls_mpi *)&TB.s), iVar4 != 0))))
            goto LAB_0019adc9;
            mbedtls_mpi_shift_r((mbedtls_mpi *)psVar1,1);
            mbedtls_mpi_shift_r((mbedtls_mpi *)&V1.s,1);
          }
          iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&U2.s);
          if (iVar4 < 0) {
            iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U2.s,(mbedtls_mpi *)&U2.s,
                                        (mbedtls_mpi *)&V2.s);
            if ((iVar4 != 0) ||
               (iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,
                                            (mbedtls_mpi *)&TA.s), iVar4 != 0)) goto LAB_0019adc9;
            pmVar2 = &V1;
            pmVar3 = &U1;
          }
          else {
            iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&V2.s,(mbedtls_mpi *)&V2.s,
                                        (mbedtls_mpi *)&U2.s);
            if ((iVar4 != 0) ||
               (iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&TA.s,(mbedtls_mpi *)&TA.s,
                                            (mbedtls_mpi *)psVar1), iVar4 != 0)) goto LAB_0019adc9;
            pmVar2 = &U1;
            pmVar3 = &V1;
          }
          iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&pmVar2->s,(mbedtls_mpi *)&pmVar2->s,
                                      (mbedtls_mpi *)&pmVar3->s);
          if (iVar4 != 0) goto LAB_0019adc9;
          iVar4 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&V2.s,0);
        } while (iVar4 != 0);
        psVar1 = &TV.s;
        do {
          iVar4 = mbedtls_mpi_cmp_int((mbedtls_mpi *)psVar1,0);
          if (-1 < iVar4) {
            psVar1 = &TV.s;
            goto LAB_0019b0c3;
          }
          iVar4 = mbedtls_mpi_add_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,N);
        } while (iVar4 == 0);
      }
    }
    else {
      iVar4 = -0xe;
    }
  }
  goto LAB_0019adc9;
  while (iVar4 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)psVar1,(mbedtls_mpi *)psVar1,N), iVar4 == 0) {
LAB_0019b0c3:
    iVar4 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)psVar1,N);
    if (iVar4 < 0) {
      iVar4 = mbedtls_mpi_copy(X,(mbedtls_mpi *)&TV.s);
      break;
    }
  }
LAB_0019adc9:
  mbedtls_mpi_free((mbedtls_mpi *)&TB.s);
  mbedtls_mpi_free((mbedtls_mpi *)&V2.s);
  mbedtls_mpi_free((mbedtls_mpi *)&TA.s);
  mbedtls_mpi_free((mbedtls_mpi *)&U1.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_c0);
  mbedtls_mpi_free((mbedtls_mpi *)&G.s);
  mbedtls_mpi_free((mbedtls_mpi *)&U2.s);
  mbedtls_mpi_free((mbedtls_mpi *)&TV.s);
  mbedtls_mpi_free((mbedtls_mpi *)&V1.s);
  return iVar4;
}

Assistant:

int mbedtls_mpi_inv_mod(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(N != NULL);

    if (mbedtls_mpi_cmp_int(N, 1) <= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&TA); mbedtls_mpi_init(&TU); mbedtls_mpi_init(&U1); mbedtls_mpi_init(&U2);
    mbedtls_mpi_init(&G); mbedtls_mpi_init(&TB); mbedtls_mpi_init(&TV);
    mbedtls_mpi_init(&V1); mbedtls_mpi_init(&V2);

    MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(&G, A, N));

    if (mbedtls_mpi_cmp_int(&G, 1) != 0) {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&TA, A, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TU, &TA));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TV, N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U1, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U2, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V1, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V2, 1));

    do {
        while ((TU.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TU, 1));

            if ((U1.p[0] & 1) != 0 || (U2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&U1, &U1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U2, 1));
        }

        while ((TV.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TV, 1));

            if ((V1.p[0] & 1) != 0 || (V2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V2, 1));
        }

        if (mbedtls_mpi_cmp_mpi(&TU, &TV) >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TU, &TU, &TV));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U1, &U1, &V1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &V2));
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TV, &TV, &TU));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, &U1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &U2));
        }
    } while (mbedtls_mpi_cmp_int(&TU, 0) != 0);

    while (mbedtls_mpi_cmp_int(&V1, 0) < 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, N));
    }

    while (mbedtls_mpi_cmp_mpi(&V1, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, N));
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &V1));

cleanup:

    mbedtls_mpi_free(&TA); mbedtls_mpi_free(&TU); mbedtls_mpi_free(&U1); mbedtls_mpi_free(&U2);
    mbedtls_mpi_free(&G); mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TV);
    mbedtls_mpi_free(&V1); mbedtls_mpi_free(&V2);

    return ret;
}